

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::testRunEnded(ConsoleReporter *this,TestRunStats *_testRunStats)

{
  printTotalsDivider(this,&_testRunStats->totals);
  printTestRunTotals((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                     (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr,
                     &_testRunStats->totals);
  std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,'\n');
  std::ostream::flush();
  (this->super_StreamingReporterBase).currentTestCaseInfo = (TestCaseInfo *)0x0;
  return;
}

Assistant:

void ConsoleReporter::testRunEnded(TestRunStats const& _testRunStats) {
    printTotalsDivider(_testRunStats.totals);
    printTestRunTotals( m_stream, *m_colour, _testRunStats.totals );
    m_stream << '\n' << std::flush;
    StreamingReporterBase::testRunEnded(_testRunStats);
}